

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuaranteedThroughputProbabilisticSampler.h
# Opt level: O2

SamplingStatus * __thiscall
jaegertracing::samplers::GuaranteedThroughputProbabilisticSampler::isSampled
          (SamplingStatus *__return_storage_ptr__,GuaranteedThroughputProbabilisticSampler *this,
          TraceID *id,string *operation)

{
  RateLimitingSampler *pRVar1;
  SamplingStatus samplingStatus;
  SamplingStatus local_90;
  bool local_70 [8];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_68;
  undefined1 local_50 [8];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_48;
  
  ProbabilisticSampler::isSampled(&local_90,&this->_probabilisticSampler,id,operation);
  if (local_90._isSampled == true) {
    pRVar1 = (this->_lowerBoundSampler)._M_t.
             super___uniq_ptr_impl<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
             .super__Head_base<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_false>.
             _M_head_impl;
    (*(pRVar1->super_Sampler)._vptr_Sampler[2])(local_50,pRVar1,id,operation);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_48);
    SamplingStatus::SamplingStatus(__return_storage_ptr__,&local_90);
  }
  else {
    pRVar1 = (this->_lowerBoundSampler)._M_t.
             super___uniq_ptr_impl<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
             .super__Head_base<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_false>.
             _M_head_impl;
    (*(pRVar1->super_Sampler)._vptr_Sampler[2])(local_70,pRVar1,id,operation);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_68);
    SamplingStatus::SamplingStatus(__return_storage_ptr__,local_70[0],&this->_tags);
  }
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_90._tags);
  return __return_storage_ptr__;
}

Assistant:

SamplingStatus isSampled(const TraceID& id,
                             const std::string& operation) override
    {
        const auto samplingStatus =
            _probabilisticSampler.isSampled(id, operation);
        if (samplingStatus.isSampled()) {
            _lowerBoundSampler->isSampled(id, operation);
            return samplingStatus;
        }
        const auto sampled =
            _lowerBoundSampler->isSampled(id, operation).isSampled();
        return SamplingStatus(sampled, _tags);
    }